

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_DDict *
ZSTD_createDDict_advanced
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_customMem customMem)

{
  ZSTD_DDict *ddict;
  size_t sVar1;
  
  if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    if (customMem.customAlloc == (ZSTD_allocFunction)0x0) {
      ddict = (ZSTD_DDict *)malloc(0x6ad8);
    }
    else {
      ddict = (ZSTD_DDict *)(*customMem.customAlloc)(customMem.opaque,0x6ad8);
    }
    if (ddict != (ZSTD_DDict *)0x0) {
      (ddict->cMem).opaque = customMem.opaque;
      (ddict->cMem).customAlloc = customMem.customAlloc;
      (ddict->cMem).customFree = customMem.customFree;
      sVar1 = ZSTD_initDDict_internal(ddict,dict,dictSize,dictLoadMethod,dictContentType);
      if (sVar1 < 0xffffffffffffff89) {
        return ddict;
      }
      ZSTD_freeDDict(ddict);
    }
  }
  return (ZSTD_DDict *)0x0;
}

Assistant:

ZSTD_DDict* ZSTD_createDDict_advanced(const void* dict, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_customMem customMem)
{
    if ((!customMem.customAlloc) ^ (!customMem.customFree)) return NULL;

    {   ZSTD_DDict* const ddict = (ZSTD_DDict*) ZSTD_customMalloc(sizeof(ZSTD_DDict), customMem);
        if (ddict == NULL) return NULL;
        ddict->cMem = customMem;
        {   size_t const initResult = ZSTD_initDDict_internal(ddict,
                                            dict, dictSize,
                                            dictLoadMethod, dictContentType);
            if (ZSTD_isError(initResult)) {
                ZSTD_freeDDict(ddict);
                return NULL;
        }   }
        return ddict;
    }
}